

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_yang.c
# Opt level: O2

LY_ERR parse_deviation(lysp_yang_ctx *ctx,lysp_deviation **deviations)

{
  long *plVar1;
  size_t len;
  LY_ERR LVar2;
  long *plVar3;
  long lVar4;
  lysp_ext_instance **pplVar5;
  char *pcVar6;
  lysp_ext_instance **pplVar7;
  char *format;
  lysp_ext_instance *plVar8;
  ly_ctx *plVar9;
  ly_stmt lVar10;
  lysp_deviation *plVar11;
  bool bVar12;
  lysp_ext_instance **in_stack_ffffffffffffff70;
  ly_stmt kw;
  char *word;
  size_t word_len;
  lysp_ext_instance **local_70;
  lysp_ext_instance **local_68;
  lysp_ext_instance **local_60;
  char *buf;
  lysf_ctx local_50;
  
  local_50.mod = (lys_module *)0x0;
  local_50.ext_set.size = 0;
  local_50.ext_set.count = 0;
  local_50.ext_set.field_2.dnodes = (lyd_node **)0x0;
  if (ctx == (lysp_yang_ctx *)0x0) {
    local_50.ctx = (ly_ctx *)0x0;
  }
  else {
    local_50.ctx = (ly_ctx *)
                   **(undefined8 **)(ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
  }
  plVar11 = *deviations;
  if (plVar11 == (lysp_deviation *)0x0) {
    plVar3 = (long *)malloc(0x30);
    if (plVar3 == (long *)0x0) goto LAB_00174e95;
    *plVar3 = 1;
    lVar4 = 1;
  }
  else {
    plVar8 = plVar11[-1].exts;
    plVar11[-1].exts = (lysp_ext_instance *)((long)&plVar8->name + 1);
    plVar3 = (long *)realloc(&plVar11[-1].exts,(long)plVar8 * 0x28 + 0x30);
    if (plVar3 == (long *)0x0) {
      (*deviations)[-1].exts = (lysp_ext_instance *)((long)&(*deviations)[-1].exts[-1].exts + 7);
LAB_00174e95:
      if (ctx == (lysp_yang_ctx *)0x0) {
        plVar9 = (ly_ctx *)0x0;
      }
      else {
        plVar9 = (ly_ctx *)
                 **(undefined8 **)(ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
      }
      ly_log(plVar9,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","parse_deviation");
      return LY_EMEM;
    }
    lVar4 = *plVar3;
  }
  *deviations = (lysp_deviation *)(plVar3 + 1);
  plVar1 = plVar3 + lVar4 * 5;
  plVar11 = (lysp_deviation *)(plVar1 + -4);
  plVar1[-2] = 0;
  plVar1[-1] = 0;
  plVar11->nodeid = (char *)0x0;
  plVar1[-3] = 0;
  *plVar1 = 0;
  LVar2 = get_argument(ctx,Y_STR_ARG,(uint16_t *)0x0,&word,&buf,&word_len);
  len = word_len;
  if (LVar2 == LY_SUCCESS) {
    local_70 = (lysp_ext_instance **)(lVar4 * 0x28);
    if (word_len == 0) {
      if (ctx == (lysp_yang_ctx *)0x0) {
        plVar9 = (ly_ctx *)0x0;
      }
      else {
        plVar9 = (ly_ctx *)
                 **(undefined8 **)(ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
      }
      ly_log(plVar9,LY_LLWRN,LY_SUCCESS,"Empty argument of %s statement does not make sense.",
             "deviation");
    }
    if (buf == (char *)0x0) {
      if (ctx == (lysp_yang_ctx *)0x0) {
        plVar9 = (ly_ctx *)0x0;
      }
      else {
        plVar9 = (ly_ctx *)
                 **(undefined8 **)(ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
      }
      pcVar6 = word;
      if (len == 0) {
        pcVar6 = "";
      }
      LVar2 = lydict_insert(plVar9,pcVar6,len,(char **)plVar11);
    }
    else {
      if (ctx == (lysp_yang_ctx *)0x0) {
        plVar9 = (ly_ctx *)0x0;
      }
      else {
        plVar9 = (ly_ctx *)
                 **(undefined8 **)(ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
      }
      LVar2 = lydict_insert_zc(plVar9,word,(char **)plVar11);
    }
    if ((LVar2 == LY_SUCCESS) && (LVar2 = get_keyword(ctx,&kw,&word,&word_len), LVar2 == LY_SUCCESS)
       ) {
      if (kw == LY_STMT_SYNTAX_SEMICOLON) {
        bVar12 = false;
      }
      else {
        if (kw != LY_STMT_SYNTAX_LEFT_BRACE) {
          if (ctx == (lysp_yang_ctx *)0x0) {
            plVar9 = (ly_ctx *)0x0;
          }
          else {
            plVar9 = (ly_ctx *)
                     **(undefined8 **)
                       (ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
          }
          pcVar6 = lyplg_ext_stmt2str(kw);
          ly_vlog(plVar9,(char *)0x0,LYVE_SYNTAX_YANG,
                  "Invalid keyword \"%s\", expected \";\" or \"{\".",pcVar6);
LAB_00175212:
          LVar2 = LY_EVALID;
          goto LAB_00174f88;
        }
        LVar2 = get_keyword(ctx,&kw,&word,&word_len);
        if (LVar2 != LY_SUCCESS) goto LAB_00174f88;
        bVar12 = kw != LY_STMT_SYNTAX_RIGHT_BRACE;
      }
      pplVar5 = (lysp_ext_instance **)((long)local_70 + (long)plVar3);
      local_68 = pplVar5 + -2;
      local_70 = pplVar5 + -1;
      local_60 = pplVar5 + -3;
      lVar10 = kw;
      do {
        if (!bVar12) {
          if (*local_70 != (lysp_ext_instance *)0x0) {
            return LY_SUCCESS;
          }
          if (ctx == (lysp_yang_ctx *)0x0) {
            plVar9 = (ly_ctx *)0x0;
          }
          else {
            plVar9 = (ly_ctx *)
                     **(undefined8 **)
                       (ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
          }
          format = "Missing mandatory keyword \"%s\" as a child of \"%s\".";
          pcVar6 = "deviate";
LAB_0017520b:
          ly_vlog(plVar9,(char *)0x0,LYVE_SYNTAX_YANG,format,pcVar6,"deviation");
          goto LAB_00175212;
        }
        if (lVar10 == LY_STMT_REFERENCE) {
          plVar8 = *local_68;
          lVar10 = LY_STMT_REFERENCE;
          pplVar7 = local_68;
LAB_0017509a:
          LVar2 = parse_text_field(ctx,plVar8,lVar10,(uint32_t)pplVar7,(char **)0x2,Y_IDENTIF_ARG,
                                   (uint16_t *)pplVar5,in_stack_ffffffffffffff70);
        }
        else if (lVar10 == LY_STMT_DEVIATE) {
          LVar2 = parse_deviate(ctx,(lysp_deviate **)local_70);
        }
        else {
          if (lVar10 != LY_STMT_EXTENSION_INSTANCE) {
            if (lVar10 != LY_STMT_DESCRIPTION) {
              if (ctx == (lysp_yang_ctx *)0x0) {
                plVar9 = (ly_ctx *)0x0;
              }
              else {
                plVar9 = (ly_ctx *)
                         **(undefined8 **)
                           (ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
              }
              pcVar6 = lyplg_ext_stmt2str(lVar10);
              format = "Invalid keyword \"%s\" as a child of \"%s\".";
              goto LAB_0017520b;
            }
            plVar8 = *local_60;
            lVar10 = LY_STMT_DESCRIPTION;
            pplVar7 = local_60;
            goto LAB_0017509a;
          }
          LVar2 = parse_ext(ctx,word,word_len,plVar11,LY_STMT_DEVIATION,0,pplVar5);
        }
      } while (((LVar2 == LY_SUCCESS) &&
               (LVar2 = get_keyword(ctx,&kw,&word,&word_len), lVar10 = kw, LVar2 == LY_SUCCESS)) &&
              ((bVar12 = kw != LY_STMT_SYNTAX_RIGHT_BRACE, bVar12 ||
               ((*pplVar5 == (lysp_ext_instance *)0x0 ||
                (LVar2 = ly_set_add(&ctx->main_ctx->ext_inst,*pplVar5,'\x01',(uint32_t *)0x0),
                LVar2 == LY_SUCCESS))))));
    }
  }
LAB_00174f88:
  lysp_deviation_free(&local_50,plVar11);
  plVar11 = *deviations;
  pplVar5 = &plVar11[-1].exts;
  *pplVar5 = (lysp_ext_instance *)((long)&(*pplVar5)[-1].exts + 7);
  if (*pplVar5 == (lysp_ext_instance *)0x0) {
    free(&plVar11[-1].exts);
    *deviations = (lysp_deviation *)0x0;
  }
  return LVar2;
}

Assistant:

LY_ERR
parse_deviation(struct lysp_yang_ctx *ctx, struct lysp_deviation **deviations)
{
    LY_ERR ret = LY_SUCCESS;
    char *buf, *word;
    size_t word_len;
    enum ly_stmt kw;
    struct lysp_deviation *dev;
    struct lysf_ctx fctx = {.ctx = PARSER_CTX(ctx)};

    LY_ARRAY_NEW_RET(PARSER_CTX(ctx), *deviations, dev, LY_EMEM);

    /* get value */
    LY_CHECK_GOTO(ret = get_argument(ctx, Y_STR_ARG, NULL, &word, &buf, &word_len), cleanup);
    CHECK_NONEMPTY(ctx, word_len, "deviation");
    INSERT_WORD_GOTO(ctx, buf, dev->nodeid, word, word_len, ret, cleanup);

    YANG_READ_SUBSTMT_FOR_GOTO(ctx, kw, word, word_len, ret, cleanup) {
        switch (kw) {
        case LY_STMT_DESCRIPTION:
            ret = parse_text_field(ctx, dev->dsc, LY_STMT_DESCRIPTION, 0, &dev->dsc, Y_STR_ARG, NULL, &dev->exts);
            LY_CHECK_GOTO(ret, cleanup);
            break;
        case LY_STMT_DEVIATE:
            LY_CHECK_GOTO(ret = parse_deviate(ctx, &dev->deviates), cleanup);
            break;
        case LY_STMT_REFERENCE:
            ret = parse_text_field(ctx, dev->ref, LY_STMT_REFERENCE, 0, &dev->ref, Y_STR_ARG, NULL, &dev->exts);
            LY_CHECK_GOTO(ret, cleanup);
            break;
        case LY_STMT_EXTENSION_INSTANCE:
            LY_CHECK_GOTO(ret = parse_ext(ctx, word, word_len, dev, LY_STMT_DEVIATION, 0, &dev->exts), cleanup);
            break;
        default:
            LOGVAL_PARSER(ctx, LY_VCODE_INCHILDSTMT, lyplg_ext_stmt2str(kw), "deviation");
            ret = LY_EVALID;
            goto cleanup;
        }
        YANG_READ_SUBSTMT_NEXT_ITER(ctx, kw, word, word_len, dev->exts, ret, cleanup);
    }

    /* mandatory substatements */
    if (!dev->deviates) {
        LOGVAL_PARSER(ctx, LY_VCODE_MISSTMT, "deviate", "deviation");
        ret = LY_EVALID;
        goto cleanup;
    }

cleanup:
    if (ret) {
        lysp_deviation_free(&fctx, dev);
        LY_ARRAY_DECREMENT_FREE(*deviations);
    }
    return ret;
}